

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_string.hpp
# Opt level: O3

bool __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::Keyword_(ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
           *this,Static_String *t_s)

{
  ulong uVar1;
  char *pcVar2;
  ulong uVar3;
  char *pcVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  bool bVar9;
  
  uVar1 = t_s->m_size;
  pcVar4 = (this->m_position).m_pos;
  pcVar2 = (this->m_position).m_end;
  if ((ulong)((long)pcVar2 - (long)pcVar4) < uVar1) {
    return false;
  }
  iVar6 = (this->m_position).line;
  iVar8 = (this->m_position).col;
  iVar5 = (this->m_position).m_last_col;
  if (uVar1 != 0 && pcVar4 != pcVar2) {
    uVar3 = 1;
    do {
      uVar7 = uVar3;
      if (pcVar4[uVar7 - 1] != t_s->data[uVar7 - 1]) {
        return false;
      }
      bVar9 = pcVar4[uVar7 - 1] == '\n';
      if (bVar9) {
        iVar5 = iVar8;
      }
      iVar8 = iVar8 + 1;
      if (bVar9) {
        iVar8 = 1;
      }
      iVar6 = iVar6 + (uint)bVar9;
    } while ((pcVar4 + uVar7 != pcVar2) && (uVar3 = uVar7 + 1, uVar7 < uVar1));
    pcVar4 = pcVar4 + uVar7;
  }
  (this->m_position).line = iVar6;
  (this->m_position).col = iVar8;
  (this->m_position).m_pos = pcVar4;
  (this->m_position).m_last_col = iVar5;
  return true;
}

Assistant:

constexpr size_t size() const noexcept { return m_size; }